

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLGAPSIDESIDEWHITE_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  int *outNBElement_local;
  int *outBegIdx_local;
  int endIdx_local;
  int startIdx_local;
  TA_ParamHolderPriv *params_local;
  
  TVar1 = TA_CDLGAPSIDESIDEWHITE
                    (startIdx,endIdx,(params->in->data).inReal,(params->in->data).inPrice.high,
                     (params->in->data).inPrice.low,(params->in->data).inPrice.close,outBegIdx,
                     outNBElement,(params->out->data).outInteger);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLGAPSIDESIDEWHITE_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLGAPSIDESIDEWHITE(
/* Generated */                             startIdx,
/* Generated */                             endIdx,
/* Generated */                             params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                             params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                             params->in[0].data.inPrice.low, /* inLow */
/* Generated */                             params->in[0].data.inPrice.close, /* inClose */
/* Generated */                             outBegIdx, 
/* Generated */                             outNBElement, 
/* Generated */                             params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }